

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interp.cc
# Opt level: O0

int ProgramMain(int argc,char **argv)

{
  Enum EVar1;
  Result local_2c;
  Result result;
  unique_ptr<wabt::FileStream,_std::default_delete<wabt::FileStream>_> local_20;
  char **local_18;
  char **argv_local;
  int argc_local;
  
  local_18 = argv;
  argv_local._4_4_ = argc;
  wabt::InitStdio();
  wabt::FileStream::CreateStdout();
  std::unique_ptr<wabt::FileStream,_std::default_delete<wabt::FileStream>_>::operator=
            (&s_stdout_stream,&local_20);
  std::unique_ptr<wabt::FileStream,_std::default_delete<wabt::FileStream>_>::~unique_ptr(&local_20);
  wabt::FileStream::CreateStderr();
  std::unique_ptr<wabt::FileStream,_std::default_delete<wabt::FileStream>_>::operator=
            (&s_stderr_stream,
             (unique_ptr<wabt::FileStream,_std::default_delete<wabt::FileStream>_> *)
             &stack0xffffffffffffffd8);
  std::unique_ptr<wabt::FileStream,_std::default_delete<wabt::FileStream>_>::~unique_ptr
            ((unique_ptr<wabt::FileStream,_std::default_delete<wabt::FileStream>_> *)
             &stack0xffffffffffffffd8);
  ParseOptions(argv_local._4_4_,local_18);
  wabt::interp::Store::setFeatures(&s_store,&s_features);
  local_2c = ReadAndRunModule(s_infile);
  EVar1 = wabt::Result::operator_cast_to_Enum(&local_2c);
  return (int)(EVar1 != Ok);
}

Assistant:

int ProgramMain(int argc, char** argv) {
  InitStdio();
  s_stdout_stream = FileStream::CreateStdout();
  s_stderr_stream = FileStream::CreateStderr();

  ParseOptions(argc, argv);
  s_store.setFeatures(s_features);

  wabt::Result result = ReadAndRunModule(s_infile);
  return result != wabt::Result::Ok;
}